

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O3

string * get_yandex_oauth_token_abi_cxx11_(void)

{
  socket_t __fd;
  future_status fVar1;
  string *in_RDI;
  thread server_thread;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ftr;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  promiseToken;
  Server server;
  thread local_198;
  __basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  undefined1 local_180 [32];
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_148;
  Server local_140;
  
  local_140.base_dir_._M_dataplus._M_p = (pointer)&local_140.base_dir_.field_2;
  local_140._vptr_Server = (_func_int **)&PTR__Server_0016f230;
  local_140.keep_alive_max_count_ = 5;
  local_140.is_running_ = false;
  local_140.svr_sock_ = -1;
  local_140.base_dir_._M_string_length = 0;
  local_140.base_dir_.field_2._M_local_buf[0] = '\0';
  memset(&local_140.get_handlers_,0,0xe4);
  signal(0xd,(__sighandler_t)0x1);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  promise(&local_160);
  std::
  __basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  __basic_future(&local_190,&local_160._M_future);
  local_180._0_8_ = &local_140;
  local_148 = &local_160;
  std::thread::
  thread<void(&)(httplib::Server*,std::promise<std::__cxx11::string>*),httplib::Server*,std::promise<std::__cxx11::string>*,void>
            (&local_198,_listen_server,(Server **)local_180,&local_148);
  system(
        "xdg-open https://oauth.yandex.ru/authorize?client_id=bc2f272cc37349b7a1320b9ac7826ebf\\&response_type=token"
        );
  local_180._0_8_ = (Server *)0x14;
  if (local_190._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_State_baseV2 *)0x0) {
    fVar1 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1l>>
                      (local_190._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(duration<long,_std::ratio<1L,_1L>_> *)local_180);
    if (fVar1 == ready) {
      std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_190);
      std::__cxx11::string::operator=((string *)in_RDI,(string *)local_180);
      if ((Server *)local_180._0_8_ != (Server *)(local_180 + 0x10)) {
        operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
      }
    }
    __fd = local_140.svr_sock_;
    if (local_140.is_running_ == true) {
      if (local_140.svr_sock_ == -1) goto LAB_0013d9ae;
      local_140.svr_sock_ = -1;
      shutdown(__fd,2);
      close(__fd);
    }
    std::thread::join();
    if (local_198._M_id._M_thread == 0) {
      if (local_190._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_190._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~promise(&local_160);
      httplib::Server::~Server(&local_140);
      return in_RDI;
    }
    std::terminate();
  }
  std::__throw_future_error(3);
LAB_0013d9ae:
  __assert_fail("svr_sock_ != INVALID_SOCKET",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ivanenko[P]ydisk_commander/httplib.h"
                ,0x650,"void httplib::Server::stop()");
}

Assistant:

std::string get_yandex_oauth_token()
{
    httplib::Server server;
    std::string token;

    std::promise<std::string> promiseToken;
    std::future<std::string> ftr = promiseToken.get_future();

    //create and run server on separate thread
    std::thread server_thread(_listen_server, &server, &promiseToken);

    //TODO add win32 browser open
    system("xdg-open https://oauth.yandex.ru/authorize?client_id=bc2f272cc37349b7a1320b9ac7826ebf\\&response_type=token");

    try{
        std::future_status ftr_status = ftr.wait_for(std::chrono::seconds(20));
        if(ftr_status == std::future_status::ready) {
            token = ftr.get();
        } else if (ftr_status == std::future_status::timeout){
            //std::cout << "Timeout!!! token is unknown\n";
        } else {
            //std::cout << "Future status = deffered\n";
        }

    } catch(std::exception & e) {
        //std::cout << e.what() << std::endl;
    }

    server.stop();
    server_thread.join();

    return token;
}